

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall antlr::Parser::reportError(Parser *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*this->_vptr_Parser[8])(&local_40,this);
  bVar1 = std::operator==(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: ");
    poVar2 = std::operator<<(poVar2,(s->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    (*this->_vptr_Parser[8])(&local_40,this);
    poVar2 = std::operator<<((ostream *)&std::cerr,local_40._M_dataplus._M_p);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,(s->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Parser::reportError(const ANTLR_USE_NAMESPACE(std)string& s)
{
	if ( getFilename()=="" )
		ANTLR_USE_NAMESPACE(std)cerr << "error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
	else
		ANTLR_USE_NAMESPACE(std)cerr << getFilename().c_str() << ": error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}